

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O0

void FT_List_Add(FT_List list,FT_ListNode node)

{
  FT_ListNode pFVar1;
  FT_ListNode before;
  FT_ListNode node_local;
  FT_List list_local;
  
  if ((list != (FT_List)0x0) && (node != (FT_ListNode)0x0)) {
    pFVar1 = list->tail;
    node->next = (FT_ListNode)0x0;
    node->prev = pFVar1;
    if (pFVar1 == (FT_ListNode)0x0) {
      list->head = node;
    }
    else {
      pFVar1->next = node;
    }
    list->tail = node;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Add( FT_List      list,
               FT_ListNode  node )
  {
    FT_ListNode  before;


    if ( !list || !node )
      return;

    before = list->tail;

    node->next = NULL;
    node->prev = before;

    if ( before )
      before->next = node;
    else
      list->head = node;

    list->tail = node;
  }